

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

double __thiscall booster::log::sinks::file::log(file *this,double __x)

{
  data *pdVar1;
  ostream *poVar2;
  double dVar3;
  message *in_stack_00000228;
  int in_stack_000002b4;
  message *in_stack_000002b8;
  string local_60 [48];
  string local_30 [40];
  file *local_8;
  
  local_8 = this;
  if ((this->use_local_time_ & 1U) == 0) {
    pdVar1 = hold_ptr<booster::log::sinks::file::data>::operator->(&this->d);
    format_plain_text_message_tz_abi_cxx11_(in_stack_000002b8,in_stack_000002b4);
    poVar2 = std::operator<<((ostream *)&pdVar1->field_0x10,local_60);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    dVar3 = (double)std::__cxx11::string::~string(local_60);
  }
  else {
    pdVar1 = hold_ptr<booster::log::sinks::file::data>::operator->(&this->d);
    format_plain_text_message_abi_cxx11_(in_stack_00000228);
    poVar2 = std::operator<<((ostream *)&pdVar1->field_0x10,local_30);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    dVar3 = (double)std::__cxx11::string::~string(local_30);
  }
  return dVar3;
}

Assistant:

void file::log(message const &msg)
		{
			if(use_local_time_)
				d->stream << format_plain_text_message(msg) << std::endl;
			else
				d->stream << format_plain_text_message_tz(msg,tz_offset_) << std::endl;
		}